

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeLanguageCommand.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_f9b971::cmCMakeLanguageCommandDEFER
          (anon_unknown_dwarf_f9b971 *this,Defer *defer,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,size_t arg,cmExecutionStatus *status)

{
  long *plVar1;
  size_type sVar2;
  bool bVar3;
  string *psVar4;
  char cVar5;
  long lVar6;
  string *id;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  string_view value;
  string_view value_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ids;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  size_type local_98;
  long *local_90;
  undefined8 local_88;
  char *local_80;
  undefined1 local_78 [32];
  bool local_58;
  string local_50;
  
  if (this == (anon_unknown_dwarf_f9b971 *)0x0) {
    this = (anon_unknown_dwarf_f9b971 *)status->Makefile;
  }
  plVar1 = (long *)(&defer->Id)[arg]._M_dataplus._M_p;
  sVar2 = (&defer->Id)[arg]._M_string_length;
  if (sVar2 == 8) {
    if (*plVar1 == 0x4c4c41435f544547) {
      lVar6 = (long)args - (long)defer >> 5;
      if (arg + 1 == lVar6) {
        local_a8._M_len = (size_t)&local_98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"DEFER GET_CALL missing id","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else if (arg + 2 == lVar6) {
        local_a8._M_len = (size_t)&local_98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"DEFER GET_CALL missing output variable","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else if (arg + 3 == lVar6) {
        psVar4 = &defer->IdVar + arg;
        if (psVar4->_M_string_length != 0) {
          plVar1 = (long *)(psVar4->_M_dataplus)._M_p;
          if (0x19 < (byte)((char)*plVar1 + 0xbfU)) {
            cmMakefile::DeferGetCall
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_78,(cmMakefile *)this,psVar4);
            cVar5 = local_58;
            if (local_58 != false) {
              value_00._M_str = (char *)local_78._0_8_;
              value_00._M_len = local_78._8_8_;
              cmMakefile::AddDefinition
                        (status->Makefile,(string *)(&defer->Directory + arg * 4),value_00);
              goto LAB_00330d08;
            }
            psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((cmMakefile *)this);
            local_90 = (long *)(psVar4->_M_dataplus)._M_p;
            local_98 = psVar4->_M_string_length;
            local_a8._M_len = 0x2b;
            local_a8._M_str = "DEFER GET_CALL may not access directory:\n  ";
            local_88 = 0xe;
            local_80 = "\nat this time.";
            views_04._M_len = 3;
            views_04._M_array = &local_a8;
            cmCatViews_abi_cxx11_(&local_50,views_04);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_00330ce3;
          }
          local_a8._M_len = 0x22;
          local_a8._M_str = "DEFER GET_CALL unknown argument:\n ";
          views_00._M_len = 2;
          views_00._M_array = &local_a8;
          local_98 = psVar4->_M_string_length;
          local_90 = plVar1;
          cmCatViews_abi_cxx11_((string *)local_78,views_00);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00330a2e;
        }
        local_a8._M_len = (size_t)&local_98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"DEFER GET_CALL id may not be empty","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else {
        local_a8._M_len = (size_t)&local_98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"DEFER GET_CALL given too many arguments","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
LAB_00330d99:
      local_78._16_8_ = local_98;
      local_78._0_8_ = local_a8._M_len;
      if ((size_type *)local_a8._M_len == &local_98) {
        cmSystemTools::s_FatalErrorOccurred = true;
        return false;
      }
      goto LAB_00330a4b;
    }
LAB_003309f0:
    local_a8._M_len = 0x19;
    local_a8._M_str = "DEFER operation unknown: ";
    views._M_len = 2;
    views._M_array = &local_a8;
    local_98 = sVar2;
    local_90 = plVar1;
    cmCatViews_abi_cxx11_((string *)local_78,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    if (sVar2 == 0xc) {
      if ((int)plVar1[1] == 0x5344495f && *plVar1 == 0x4c4c41435f544547) {
        lVar6 = (long)args - (long)defer >> 5;
        if (arg + 1 == lVar6) {
          local_a8._M_len = (size_t)&local_98;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"DEFER GET_CALL_IDS missing output variable","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        else {
          if (arg + 2 == lVar6) {
            cmMakefile::DeferGetCallIds_abi_cxx11_
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_78,(cmMakefile *)this);
            cVar5 = local_58;
            if (local_58 != false) {
              value._M_str = (char *)local_78._0_8_;
              value._M_len = local_78._8_8_;
              cmMakefile::AddDefinition(status->Makefile,&defer->IdVar + arg,value);
              goto LAB_00330d08;
            }
            psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((cmMakefile *)this);
            local_90 = (long *)(psVar4->_M_dataplus)._M_p;
            local_98 = psVar4->_M_string_length;
            local_a8._M_len = 0x2f;
            local_a8._M_str = "DEFER GET_CALL_IDS may not access directory:\n  ";
            local_88 = 0xe;
            local_80 = "\nat this time.";
            views_03._M_len = 3;
            views_03._M_array = &local_a8;
            cmCatViews_abi_cxx11_(&local_50,views_03);
            std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00330ce3:
            cmSystemTools::s_FatalErrorOccurred = true;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
LAB_00330d08:
            if (local_58 != true) {
              return (bool)cVar5;
            }
            local_58 = false;
            if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
              operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
              return (bool)cVar5;
            }
            return (bool)cVar5;
          }
          local_a8._M_len = (size_t)&local_98;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"DEFER GET_CALL_IDS given too many arguments","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        goto LAB_00330d99;
      }
      goto LAB_003309f0;
    }
    if ((sVar2 != 0xb) ||
       (*(long *)((long)plVar1 + 3) != 0x4c4c41435f4c4543 || *plVar1 != 0x435f4c45434e4143))
    goto LAB_003309f0;
    psVar4 = &defer->Id + arg;
    do {
      id = psVar4 + 1;
      if (id == (string *)args) {
        return true;
      }
      local_90 = (long *)(id->_M_dataplus)._M_p;
      if ((byte)((char)*local_90 + 0xbfU) < 0x1a) {
        local_98 = psVar4[1]._M_string_length;
        local_a8._M_len = 0x26;
        local_a8._M_str = "DEFER CANCEL_CALL unknown argument:\n  ";
        views_01._M_len = 2;
        views_01._M_array = &local_a8;
        cmCatViews_abi_cxx11_((string *)local_78,views_01);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_00330a2e;
      }
      bVar3 = cmMakefile::DeferCancelCall((cmMakefile *)this,id);
      psVar4 = id;
    } while (bVar3);
    psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((cmMakefile *)this);
    local_90 = (long *)(psVar4->_M_dataplus)._M_p;
    local_98 = psVar4->_M_string_length;
    local_a8._M_len = (size_t)&DAT_0000002e;
    local_a8._M_str = "DEFER CANCEL_CALL may not update directory:\n  ";
    local_88 = 0xe;
    local_80 = "\nat this time.";
    views_02._M_len = 3;
    views_02._M_array = &local_a8;
    cmCatViews_abi_cxx11_((string *)local_78,views_02);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
LAB_00330a2e:
  if ((undefined1 *)local_78._0_8_ == local_78 + 0x10) {
    cmSystemTools::s_FatalErrorOccurred = true;
    return false;
  }
LAB_00330a4b:
  cmSystemTools::s_FatalErrorOccurred = true;
  operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  return false;
}

Assistant:

bool cmCMakeLanguageCommandDEFER(Defer const& defer,
                                 std::vector<std::string> const& args,
                                 size_t arg, cmExecutionStatus& status)
{
  cmMakefile* deferMakefile =
    defer.Directory ? defer.Directory : &status.GetMakefile();
  if (args[arg] == "CANCEL_CALL"_s) {
    ++arg; // Consume CANCEL_CALL.
    auto ids = cmMakeRange(args).advance(arg);
    for (std::string const& id : ids) {
      if (id[0] >= 'A' && id[0] <= 'Z') {
        return FatalError(
          status, cmStrCat("DEFER CANCEL_CALL unknown argument:\n  "_s, id));
      }
      if (!deferMakefile->DeferCancelCall(id)) {
        return FatalError(
          status,
          cmStrCat("DEFER CANCEL_CALL may not update directory:\n  "_s,
                   deferMakefile->GetCurrentBinaryDirectory(),
                   "\nat this time."_s));
      }
    }
    return true;
  }
  if (args[arg] == "GET_CALL_IDS"_s) {
    ++arg; // Consume GET_CALL_IDS.
    if (arg == args.size()) {
      return FatalError(status, "DEFER GET_CALL_IDS missing output variable");
    }
    std::string const& var = args[arg++];
    if (arg != args.size()) {
      return FatalError(status, "DEFER GET_CALL_IDS given too many arguments");
    }
    cm::optional<std::string> ids = deferMakefile->DeferGetCallIds();
    if (!ids) {
      return FatalError(
        status,
        cmStrCat("DEFER GET_CALL_IDS may not access directory:\n  "_s,
                 deferMakefile->GetCurrentBinaryDirectory(),
                 "\nat this time."_s));
    }
    status.GetMakefile().AddDefinition(var, *ids);
    return true;
  }
  if (args[arg] == "GET_CALL"_s) {
    ++arg; // Consume GET_CALL.
    if (arg == args.size()) {
      return FatalError(status, "DEFER GET_CALL missing id");
    }
    std::string const& id = args[arg++];
    if (arg == args.size()) {
      return FatalError(status, "DEFER GET_CALL missing output variable");
    }
    std::string const& var = args[arg++];
    if (arg != args.size()) {
      return FatalError(status, "DEFER GET_CALL given too many arguments");
    }
    if (id.empty()) {
      return FatalError(status, "DEFER GET_CALL id may not be empty");
    }
    if (id[0] >= 'A' && id[0] <= 'Z') {
      return FatalError(status,
                        cmStrCat("DEFER GET_CALL unknown argument:\n "_s, id));
    }
    cm::optional<std::string> call = deferMakefile->DeferGetCall(id);
    if (!call) {
      return FatalError(
        status,
        cmStrCat("DEFER GET_CALL may not access directory:\n  "_s,
                 deferMakefile->GetCurrentBinaryDirectory(),
                 "\nat this time."_s));
    }
    status.GetMakefile().AddDefinition(var, *call);
    return true;
  }
  return FatalError(status,
                    cmStrCat("DEFER operation unknown: "_s, args[arg]));
}